

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error ft_add_renderer(FT_Module module)

{
  FT_Library pFVar1;
  FT_Memory pFVar2;
  FT_Module_Class *pFVar3;
  code *pcVar4;
  FT_ListNode pFVar5;
  int iVar6;
  FT_ListNode pFVar7;
  FT_Renderer_conflict pFVar8;
  FT_ListRec *pFVar9;
  FT_Error FVar10;
  
  pFVar1 = module->library;
  pFVar2 = pFVar1->memory;
  pFVar7 = (FT_ListNode)(*pFVar2->alloc)(pFVar2,0x18);
  if (pFVar7 == (FT_ListNode)0x0) {
    FVar10 = 0x40;
  }
  else {
    pFVar3 = module->clazz;
    module[1].clazz = pFVar3;
    iVar6 = (int)pFVar3[1].module_flags;
    *(int *)&module[1].library = iVar6;
    if ((pFVar3[1].module_interface != (void *)0x0) &&
       (pcVar4 = *(code **)((long)pFVar3[1].module_interface + 8), pcVar4 != (code *)0x0)) {
      iVar6 = (*pcVar4)(pFVar2,&module[4].library);
      if (iVar6 != 0) {
        (*pFVar2->free)(pFVar2,pFVar7);
        return iVar6;
      }
      module[4].memory = *(FT_Memory *)((long)pFVar3[1].module_interface + 0x20);
      module[5].clazz = (FT_Module_Class *)pFVar3[1].module_size;
      iVar6 = (int)pFVar3[1].module_flags;
    }
    if (iVar6 == 0x53564720) {
      module[5].clazz = (FT_Module_Class *)pFVar3[1].module_size;
    }
    pFVar7->data = module;
    pFVar5 = (pFVar1->renderers).tail;
    pFVar7->next = (FT_ListNode)0x0;
    pFVar7->prev = pFVar5;
    pFVar9 = (FT_ListRec *)&pFVar5->next;
    if (pFVar5 == (FT_ListNode)0x0) {
      pFVar9 = &pFVar1->renderers;
    }
    pFVar9->head = pFVar7;
    (pFVar1->renderers).tail = pFVar7;
    pFVar7 = (pFVar1->renderers).head;
    if (pFVar7 == (FT_ListNode)0x0) {
      pFVar1->cur_renderer = (FT_Renderer_conflict)0x0;
    }
    else {
      do {
        pFVar8 = (FT_Renderer_conflict)pFVar7->data;
        if (pFVar8->glyph_format == FT_GLYPH_FORMAT_OUTLINE) goto LAB_00215bc7;
        pFVar7 = pFVar7->next;
      } while (pFVar7 != (FT_ListNode)0x0);
      pFVar8 = (FT_Renderer_conflict)0x0;
LAB_00215bc7:
      pFVar1->cur_renderer = pFVar8;
    }
    FVar10 = 0;
  }
  return FVar10;
}

Assistant:

static FT_Error
  ft_add_renderer( FT_Module  module )
  {
    FT_Library   library = module->library;
    FT_Memory    memory  = library->memory;
    FT_Error     error;
    FT_ListNode  node    = NULL;


    if ( FT_QNEW( node ) )
      goto Exit;

    {
      FT_Renderer         render = FT_RENDERER( module );
      FT_Renderer_Class*  clazz  = (FT_Renderer_Class*)module->clazz;


      render->clazz        = clazz;
      render->glyph_format = clazz->glyph_format;

      /* allocate raster object if needed */
      if ( clazz->raster_class && clazz->raster_class->raster_new )
      {
        error = clazz->raster_class->raster_new( memory, &render->raster );
        if ( error )
          goto Fail;

        render->raster_render = clazz->raster_class->raster_render;
        render->render        = clazz->render_glyph;
      }

#ifdef FT_CONFIG_OPTION_SVG
      if ( clazz->glyph_format == FT_GLYPH_FORMAT_SVG )
        render->render = clazz->render_glyph;
#endif

      /* add to list */
      node->data = module;
      FT_List_Add( &library->renderers, node );

      ft_set_current_renderer( library );
    }

  Fail:
    if ( error )
      FT_FREE( node );

  Exit:
    return error;
  }